

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O0

void __thiscall gurkenlaeufer::Parser::parseFile(Parser *this,string *filePath)

{
  byte bVar1;
  invalid_argument *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  istream local_220 [8];
  ifstream fin;
  string *filePath_local;
  Parser *this_local;
  
  std::ifstream::ifstream(local_220,filePath,8);
  bVar1 = std::ios::fail();
  if ((bVar1 & 1) == 0) {
    parseStream(this,local_220);
    std::ifstream::~ifstream(local_220);
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&local_270,"The given cucumber feature file \'",filePath);
  std::operator+(&local_250,&local_270,"\' can not be opened!");
  std::invalid_argument::invalid_argument(this_00,(string *)&local_250);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void parseFile(const std::string& filePath)
    {
        std::ifstream fin(filePath);
        if (fin.fail()) {
            throw std::invalid_argument("The given cucumber feature file '" + filePath + "' can not be opened!");
        }
        parseStream(&fin);
    }